

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error __thiscall
asmjit::X86FuncArgsContext::markStackArgsReg(X86FuncArgsContext *this,FuncFrameInfo *ffi)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  uint *in_RSI;
  uint *in_RDI;
  uint32_t regs;
  uint32_t usedRegs;
  uint32_t saRegId;
  WorkData *wd;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  uint local_6c;
  
  if ((in_RDI[0x40] & 1) == 0) {
    return 0;
  }
  if ((*in_RSI & 1) == 0) {
    bVar1 = *(byte *)((long)in_RSI + 0x16);
    uVar2 = in_RDI[2];
    if (bVar1 == 0xff) {
      local_6c = in_RDI[1] & ((uVar2 | in_RDI[4]) ^ 0xffffffff);
      if (local_6c == 0) {
        local_6c = in_RDI[1] & (uVar2 ^ 0xffffffff);
      }
      if (local_6c == 0) {
        local_6c = *in_RDI & (in_RDI[1] ^ 0xffffffff);
      }
      if (local_6c == 0) {
        return 0x35;
      }
      if (local_6c == 0) {
        cVar3 = -1;
      }
      else {
        cVar3 = '\0';
        for (; (local_6c & 1) == 0; local_6c = local_6c >> 1 | 0x80000000) {
          cVar3 = cVar3 + '\x01';
        }
      }
      *(char *)((long)in_RSI + 0x16) = cVar3;
    }
    else {
      if (0x1f < bVar1) {
        DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
      }
      if ((uVar2 & 1 << (bVar1 & 0x1f)) != 0) {
        return 0x37;
      }
    }
  }
  else {
    *(undefined1 *)((long)in_RSI + 0x16) = 5;
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86FuncArgsContext::markStackArgsReg(FuncFrameInfo& ffi) noexcept {
  if (!_hasStackArgs)
    return kErrorOk;

  // Decide which register to use to hold the stack base address.
  if (!ffi.hasPreservedFP()) {
    WorkData& wd = _workData[X86Reg::kKindGp];
    uint32_t saRegId = ffi.getStackArgsRegId();
    uint32_t usedRegs = wd.usedRegs;

    if (saRegId != Globals::kInvalidRegId) {
      // Check if the user chosen SA register doesn't overlap with others.
      // However, it's fine if it overlaps with some 'dstMove' register.
      if (usedRegs & Utils::mask(saRegId))
        return DebugUtils::errored(kErrorOverlappingStackRegWithRegArg);
    }
    else {
      // Initially, pick some clobbered or dirty register that is neither
      // in 'used' and neither in 'dstMove'. That's the safest bet as the
      // register won't collide with anything right now.
      uint32_t regs = wd.workRegs & ~(usedRegs | wd.dstRegs);

      // If that didn't work out pick some register which is not in 'used'.
      if (!regs) regs = wd.workRegs & ~usedRegs;

      // If that didn't work out then we have to make one more register dirty.
      if (!regs) regs = wd.archRegs & ~wd.workRegs;

      // If that didn't work out we can't continue.
      if (ASMJIT_UNLIKELY(!regs))
        return DebugUtils::errored(kErrorNoMorePhysRegs);

      saRegId = Utils::findFirstBit(regs);
      ffi.setStackArgsRegId(saRegId);
    }
  }
  else {
    ffi.setStackArgsRegId(X86Gp::kIdBp);
  }

  return kErrorOk;
}